

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::teximage2d_neg_width_height
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_INVALID_VALUE is generated if width or height is less than 0.",
             "");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GL_TEXTURE_2D target","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1907,-1,1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1907,1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1907,-1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_TEXTURE_CUBE_MAP_POSITIVE_X target","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8515,0,0x1907,-1,1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8515,0,0x1907,1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8515,0,0x1907,-1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_TEXTURE_CUBE_MAP_POSITIVE_Y target","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8517,0,0x1907,-1,1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8517,0,0x1907,1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8517,0,0x1907,-1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_TEXTURE_CUBE_MAP_POSITIVE_Z target","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8519,0,0x1907,-1,1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8519,0,0x1907,1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8519,0,0x1907,-1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_TEXTURE_CUBE_MAP_NEGATIVE_X target","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8516,0,0x1907,-1,1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8516,0,0x1907,1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8516,0,0x1907,-1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8518,0,0x1907,-1,1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8518,0,0x1907,1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x8518,0,0x1907,-1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x851a,0,0x1907,-1,1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x851a,0,0x1907,1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0x851a,0,0x1907,-1,-1,0,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void teximage2d_neg_width_height (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if width or height is less than 0.");

	ctx.beginSection("GL_TEXTURE_2D target");
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, -1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, -1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_X target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, -1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, 1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, GL_RGB, -1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Y target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, -1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, 1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, GL_RGB, -1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_POSITIVE_Z target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, -1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, 1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, GL_RGB, -1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_X target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, -1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, 1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, GL_RGB, -1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Y target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, -1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, 1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, GL_RGB, -1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_TEXTURE_CUBE_MAP_NEGATIVE_Z target");
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, -1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, 1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, GL_RGB, -1, -1, 0, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.endSection();
}